

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkTSDA::IntToDescriptor
          (ChLinkTSDA *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  int iVar1;
  ChVectorRef local_80;
  Type local_68;
  
  iVar1 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if (((char)iVar1 != '\0') && (this->m_variables != (ChVariablesGenericDiagonalMass *)0x0)) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_68,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)v,(ulong)off_v,
               this->m_nstates);
    ChVariables::Get_qb(&local_80,&this->m_variables->super_ChVariables);
    Eigen::internal::
    call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_80,
               &local_68.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_68,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)R,(ulong)off_v,
               this->m_nstates);
    ChVariables::Get_fb(&local_80,&this->m_variables->super_ChVariables);
    Eigen::internal::
    call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_80,
               &local_68.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
  }
  return;
}

Assistant:

void ChLinkTSDA::IntToDescriptor(const unsigned int off_v,  // offset in v, R
                                 const ChStateDelta& v,
                                 const ChVectorDynamic<>& R,
                                 const unsigned int off_L,  // offset in L, Qc
                                 const ChVectorDynamic<>& L,
                                 const ChVectorDynamic<>& Qc) {
    if (!IsActive())
        return;

    if (m_variables) {
        m_variables->Get_qb() = v.segment(off_v, m_nstates);
        m_variables->Get_fb() = R.segment(off_v, m_nstates);
    }
}